

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O0

void __thiscall
MaterialSystemTest_testFloatArrayProperty_Test::~MaterialSystemTest_testFloatArrayProperty_Test
          (MaterialSystemTest_testFloatArrayProperty_Test *this)

{
  MaterialSystemTest_testFloatArrayProperty_Test *this_local;
  
  ~MaterialSystemTest_testFloatArrayProperty_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testFloatArrayProperty)
{
    float pf[] = {0.0f,1.0f,2.0f,3.0f};
    unsigned int pMax = sizeof(pf) / sizeof(float);
    this->pcMat->AddProperty(pf,pMax,"testKey2");
    pf[0] = pf[1] = pf[2] = pf[3] = 12.0f;

    EXPECT_EQ(AI_SUCCESS, pcMat->Get("testKey2",0,0,pf,&pMax));
    EXPECT_EQ(sizeof(pf) / sizeof(float), pMax);
    EXPECT_TRUE(!pf[0] && 1.0f == pf[1] && 2.0f == pf[2] && 3.0f == pf[3] );
}